

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  long lVar1;
  long lVar2;
  Block *args;
  Branch *pBVar3;
  long lVar4;
  pool_ref<soul::heart::Expression> local_38;
  
  this_00 = this->newModule;
  args = getRemappedBlock(this,*(Block **)(__fn + 0x18));
  pBVar3 = Module::allocate<soul::heart::Branch,soul::heart::Block&>(this_00,args);
  lVar1 = *(long *)(__fn + 0x20);
  lVar2 = *(long *)(__fn + 0x28);
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_38.object = cloneExpression(this,*(Expression **)(lVar1 + lVar4));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&pBVar3->targetArgs,&local_38);
  }
  return (int)pBVar3;
}

Assistant:

heart::Branch& clone (const heart::Branch& old)
    {
        auto& b = newModule.allocate<heart::Branch> (getRemappedBlock (old.target));

        for (auto& arg : old.targetArgs)
            b.targetArgs.push_back (cloneExpression (arg));

        return b;
    }